

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

int __thiscall SightCheck::P_SightBlockLinesIterator(SightCheck *this,int x,int y)

{
  polyblock_t *ppVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FPolyObj *pFVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  
  iVar3 = bmapwidth * y + x;
  bVar6 = 1;
  if (this->portalfound == false) {
    bVar6 = PortalBlockmap.data.Array[y * PortalBlockmap.dx + x].containsLinkedPortals;
  }
  ppVar1 = PolyBlockMap[iVar3];
  bVar7 = PortalBlockmap.hasLinkedPolyPortals;
  if (ppVar1 == (polyblock_t *)0x0) {
    bVar7 = 0;
  }
  this->portalfound = (bool)(bVar7 | bVar6);
  iVar8 = 1;
  for (; ppVar1 != (polyblock_t *)0x0; ppVar1 = ppVar1->next) {
    pFVar5 = ppVar1->polyobj;
    if (((pFVar5 != (FPolyObj *)0x0) && (pFVar5->validcount != validcount)) &&
       (pFVar5->validcount = validcount, (pFVar5->Linedefs).Count != 0)) {
      uVar9 = 0;
      do {
        bVar2 = P_SightCheckLine(this,(pFVar5->Linedefs).Array[uVar9]);
        if ((!bVar2) && (iVar8 = -1, this->portalfound != true)) {
          return 0;
        }
        uVar9 = uVar9 + 1;
        pFVar5 = ppVar1->polyobj;
      } while (uVar9 < (pFVar5->Linedefs).Count);
    }
  }
  iVar4 = blockmaplump[(long)blockmap[iVar3] + 1];
  if (iVar4 != -1) {
    piVar10 = blockmaplump + (long)blockmap[iVar3] + 2;
    do {
      bVar2 = P_SightCheckLine(this,lines + iVar4);
      if ((!bVar2) && (iVar8 = -1, this->portalfound != true)) {
        return 0;
      }
      iVar4 = *piVar10;
      piVar10 = piVar10 + 1;
    } while (iVar4 != -1);
  }
  return iVar8;
}

Assistant:

int SightCheck::P_SightBlockLinesIterator (int x, int y)
{
	int offset;
	int *list;
	int res = 1;

	polyblock_t *polyLink;
	unsigned int i;
	extern polyblock_t **PolyBlockMap;

	offset = y*bmapwidth+x;

	// if any of the previous blocks may contain a portal we may abort the collection of lines here, but we may not abort the sight check.
	// (We still try to delay activating this for as long as possible.)
	portalfound = portalfound || PortalBlockmap(x, y).containsLinkedPortals;

	polyLink = PolyBlockMap[offset];
	portalfound |= (polyLink && PortalBlockmap.hasLinkedPolyPortals);
	while (polyLink)
	{
		if (polyLink->polyobj)
		{ // only check non-empty links
			if (polyLink->polyobj->validcount != validcount)
			{
				polyLink->polyobj->validcount = validcount;
				for (i = 0; i < polyLink->polyobj->Linedefs.Size(); i++)
				{
					if (!P_SightCheckLine(polyLink->polyobj->Linedefs[i]))
					{
						if (!portalfound) return 0;
						else res = -1;
					}
				}
			}
		}
		polyLink = polyLink->next;
	}

	offset = *(blockmap + offset);

	for (list = blockmaplump + offset + 1; *list != -1; list++)
	{
		if (!P_SightCheckLine (&lines[*list]))
		{
			if (!portalfound) return 0;
			else res = -1;
		}
	}

	return res;			// everything was checked
}